

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenGlobalInitializer::generate(cmQtAutoGenGlobalInitializer *this)

{
  bool bVar1;
  
  bVar1 = InitializeCustomTargets(this);
  if (bVar1) {
    bVar1 = SetupCustomTargets(this);
    return bVar1;
  }
  return false;
}

Assistant:

bool cmQtAutoGenGlobalInitializer::generate()
{
  return (InitializeCustomTargets() && SetupCustomTargets());
}